

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O0

void calc_line_two_points
               (Am_Object *inter,bool first_point,int x,int y,bool *abort,int *out_x1,int *out_y1,
               int *out_x2,int *out_y2)

{
  Am_Value *pAVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double denom;
  double y_dist;
  double x_dist;
  int local_50;
  int local_4c;
  int d;
  int c;
  int first_y;
  int first_x;
  Am_Inter_Location last_points;
  bool want_abort;
  int min_length;
  int *out_x1_local;
  bool *abort_local;
  int y_local;
  int x_local;
  bool first_point_local;
  Am_Object *inter_local;
  
  pAVar1 = Am_Object::Get(inter,0xd9,0);
  last_points.data._4_4_ = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = Am_Object::Get(inter,0xe1,0);
  last_points.data._3_1_ = Am_Value::operator_cast_to_bool(pAVar1);
  *abort = false;
  if (first_point) {
    *out_x1 = x;
    *out_y1 = y;
    *out_x2 = x + last_points.data._4_4_;
    *out_y2 = y;
    if (((bool)last_points.data._3_1_) && (last_points.data._4_4_ != 0)) {
      *abort = true;
    }
  }
  else {
    pAVar1 = Am_Object::Get(inter,0x16a,0);
    Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&first_y,pAVar1);
    Am_Inter_Location::Get_Points((Am_Inter_Location *)&first_y,&c,&d,&local_4c,&local_50);
    *out_x1 = c;
    *out_y1 = d;
    *out_x2 = x;
    *out_y2 = y;
    if (last_points.data._4_4_ != 0) {
      dVar2 = (double)(x - c);
      dVar3 = (double)(y - d);
      dVar4 = sqrt(dVar2 * dVar2 + dVar3 * dVar3);
      if (dVar4 < (double)last_points.data._4_4_) {
        if ((last_points.data._3_1_ & 1) != 0) {
          *abort = true;
        }
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          *out_x2 = (int)((double)c + (dVar2 * (double)last_points.data._4_4_) / dVar4);
          *out_y2 = (int)((double)d + (dVar3 * (double)last_points.data._4_4_) / dVar4);
        }
        else {
          *out_x2 = c + last_points.data._4_4_;
          *out_y2 = d;
        }
      }
    }
    Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&first_y);
  }
  return;
}

Assistant:

void
calc_line_two_points(Am_Object &inter, bool first_point, int x, int y,
                     bool &abort, int &out_x1, int &out_y1, int &out_x2,
                     int &out_y2)
{
  int min_length = inter.Get(Am_MINIMUM_LENGTH);
  bool want_abort = inter.Get(Am_ABORT_IF_TOO_SMALL);

  abort = false;

  if (first_point) {
    out_x1 = x;
    out_y1 = y;
    out_x2 = x + min_length; //by default, line is horizontal
    out_y2 = y;
    if (want_abort && min_length) {
      Am_INTER_TRACE_PRINT(inter, "-- line too small");
      abort = true;
    }
  } else { // second point
    Am_Inter_Location last_points = inter.Get(Am_INTERIM_VALUE);
    int first_x, first_y, c, d;
    last_points.Get_Points(first_x, first_y, c, d);
    out_x1 = first_x;
    out_y1 = first_y;
    out_x2 = x; // these may be overwritten below if required by min_length
    out_y2 = y;
    if (min_length) { // time for expensive math
      double x_dist = x - first_x;
      double y_dist = y - first_y;
      double denom = sqrt((x_dist * x_dist) + (y_dist * y_dist));
      if (denom < (double)min_length) {
        if (want_abort) {
          Am_INTER_TRACE_PRINT(inter, "-- line too small");
          abort = true;
        }
        if (denom == 0.0) { // don't divide by zero
          out_x2 = first_x + min_length;
          out_y2 = first_y;
        } else { // not zero, create a min_length line in correct direction
          out_x2 = (int)(first_x + ((x_dist * min_length) / denom));
          out_y2 = (int)(first_y + ((y_dist * min_length) / denom));
        }
      }
      // else using x,y as set above is fine
    }
  }
}